

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::PageSegmentBase
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          *allocator,void *address,uint pageCount,uint committedCount,bool enableWriteBarrier)

{
  byte bVar1;
  PageAllocatorBaseCommon *pPVar2;
  
  pPVar2 = &allocator->super_PageAllocatorBaseCommon;
  if (allocator ==
      (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
       *)0x0) {
    pPVar2 = (PageAllocatorBaseCommon *)0x0;
  }
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator = pPVar2;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).trailingGuardPageCount = 0;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).leadingGuardPageCount = 0;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).secondaryAllocator =
       (SecondaryAllocator *)0x0;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address = (char *)0x0;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).secondaryAllocPageCount =
       allocator->secondaryAllocPageCount;
  bVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).field_0x2c;
  (this->freePages).data[0].word = 0;
  (this->freePages).data[1].word = 0;
  (this->freePages).data[2].word = 0;
  (this->freePages).data[3].word = 0;
  (this->freePages).data[4].word = 0;
  (this->decommitPages).data[0].word = 0;
  (this->decommitPages).data[1].word = 0;
  (this->decommitPages).data[2].word = 0;
  (this->decommitPages).data[3].word = 0;
  (this->decommitPages).data[4].word = 0;
  this->freePageCount = 0;
  this->decommitPageCount = 0;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).field_0x2c =
       bVar1 & 0xf8 | enableWriteBarrier * '\x02' | 4;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address = (char *)address;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).segmentPageCount = (ulong)pageCount;
  return;
}

Assistant:

PageSegmentBase<T>::PageSegmentBase(PageAllocatorBase<T> * allocator, void* address, uint pageCount, uint committedCount, bool enableWriteBarrier) :
    SegmentBase<T>(allocator, allocator->maxAllocPageCount, enableWriteBarrier), decommitPageCount(0), freePageCount(0)
{
#if DBG
    this->isPageSegment = true;
#endif // DBG
    this->address = (char*)address;
    this->segmentPageCount = pageCount;
}